

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FpgaIO.cpp
# Opt level: O0

bool __thiscall FpgaIO::WriteEthernetClearErrors(FpgaIO *this)

{
  bool bVar1;
  uint uVar2;
  uint32_t uVar3;
  uint32_t local_14;
  uint fpga_ver;
  quadlet_t write_data;
  FpgaIO *this_local;
  
  local_14 = 0x20000000;
  uVar2 = BoardIO::GetFpgaVersionMajor(&this->super_BoardIO);
  if (uVar2 == 2) {
    local_14 = 0x30000000;
  }
  else if ((uVar2 == 3) && (uVar3 = BoardIO::GetFirmwareVersion(&this->super_BoardIO), 8 < uVar3)) {
    local_14 = 0x60000000;
  }
  bVar1 = WriteEthernetControl(this,local_14);
  return bVar1;
}

Assistant:

bool FpgaIO::WriteEthernetClearErrors()
{
    quadlet_t write_data = ETH_CTRL_CLR_ERR_NET;
    unsigned int fpga_ver = GetFpgaVersionMajor();
    if (fpga_ver== 2) {
        write_data |= ETH_CTRL_CLR_ERR_LINK_V2;
    }
    else if ((fpga_ver == 3) && (GetFirmwareVersion() > 8)) {
        write_data |= ETH_CTRL_CLR_ERR_SW_V3;
    }
    return WriteEthernetControl(write_data);
}